

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

BranchJumpTableWrapper * BranchJumpTableWrapper::New(JitArenaAllocator *allocator,uint tableSize)

{
  JitArenaAllocator *pJVar1;
  BranchJumpTableWrapper *this;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  void **ppvVar2;
  TrackAllocData local_88;
  void **jmpTable;
  undefined8 local_50;
  TrackAllocData local_48;
  BranchJumpTableWrapper *local_20;
  BranchJumpTableWrapper *branchTargets;
  JitArenaAllocator *pJStack_10;
  uint tableSize_local;
  JitArenaAllocator *allocator_local;
  
  branchTargets._4_4_ = tableSize;
  pJStack_10 = allocator;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
             ,99);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          allocator,&local_48);
  jmpTable = (void **)Memory::JitArenaAllocator::Alloc;
  local_50 = 0;
  this = (BranchJumpTableWrapper *)new<Memory::JitArenaAllocator>(0x20,pJVar1,0x4e98c0);
  BranchJumpTableWrapper(this,branchTargets._4_4_);
  pJVar1 = pJStack_10;
  local_20 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,(type_info *)&void*::typeinfo,0,(ulong)branchTargets._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
             ,0x67);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar1,&local_88);
  ppvVar2 = Memory::AllocateArray<Memory::JitArenaAllocator,void*,false>
                      ((Memory *)this_00,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0
                       ,(ulong)branchTargets._4_4_);
  local_20->jmpTable = ppvVar2;
  return local_20;
}

Assistant:

static BranchJumpTableWrapper* New(JitArenaAllocator * allocator, uint tableSize)
    {
        BranchJumpTableWrapper * branchTargets = JitAnew(allocator, BranchJumpTableWrapper, tableSize);

        //Create the jump table for integers

        void* * jmpTable = JitAnewArrayZ(allocator, void*, tableSize);
        branchTargets->jmpTable = jmpTable;
        return branchTargets;
    }